

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

uint64_t __thiscall
adios2::core::engine::BP5Writer::CountStepsInMetadataIndex(BP5Writer *this,BufferSTL *bufferSTL)

{
  size_t *psVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  pointer pcVar5;
  pointer puVar6;
  long lVar7;
  ulong uVar8;
  char cVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  pointer pcVar13;
  pointer puVar14;
  uint uVar15;
  ulong uVar17;
  uint uVar18;
  char *pcVar19;
  size_type __new_size;
  size_t sVar20;
  size_t sVar21;
  uint64_t i;
  ulong uVar22;
  uint uVar23;
  uint64_t i_1;
  allocator local_16b;
  allocator local_16a;
  allocator local_169;
  vector<unsigned_long,_std::allocator<unsigned_long>_> writerToFileMap;
  uint64_t subfileIdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int iVar16;
  
  writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  pcVar13 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar13) < 0x40) {
    this->m_AppendMetadataIndexPos = 0;
    this->m_AppendMetadataPos = 0;
    this->m_AppendMetaMetadataPos = 0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._0_16_ = auVar10 << 0x40;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->m_AppendDataPos,this->m_Aggregator->m_NumAggregators,
               (value_type_conflict9 *)&writerToFileMap);
    return 0;
  }
  (bufferSTL->super_Buffer).m_Position = 0x24;
  cVar2 = pcVar13[0x24];
  (bufferSTL->super_Buffer).m_Position = 0x25;
  bVar12 = helper::IsLittleEndian();
  if ((cVar2 == '\0') != bVar12) {
    pcVar19 = "Big";
    if (cVar2 == '\0') {
      pcVar19 = "Little";
    }
    std::__cxx11::string::string((string *)&writerToFileMap,pcVar19,(allocator *)&subfileIdx);
    std::__cxx11::string::string((string *)&subfileIdx,"Engine",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&local_b8,"BP5Writer",(allocator *)&local_70);
    std::__cxx11::string::string
              ((string *)&local_d8,"CountStepsInMetadataIndex",(allocator *)&local_90);
    std::operator+(&local_118,
                   "ADIOS2 BP5 Engine only supports appending with the same endianness. The existing file is "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &writerToFileMap);
    std::operator+(&local_f8,&local_118,"Endian");
    helper::Throw<std::runtime_error>((string *)&subfileIdx,&local_b8,&local_d8,&local_f8,-1);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&subfileIdx);
    std::__cxx11::string::~string((string *)&writerToFileMap);
  }
  (bufferSTL->super_Buffer).m_Position = 0x25;
  pcVar13 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar3 = pcVar13[0x25];
  (bufferSTL->super_Buffer).m_Position = 0x26;
  if (bVar3 != 5) {
    std::__cxx11::string::string((string *)&writerToFileMap,"Engine",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&subfileIdx,"BP5Writer",(allocator *)&local_70);
    std::__cxx11::string::string
              ((string *)&local_b8,"CountStepsInMetadataIndex",(allocator *)&local_90);
    std::__cxx11::to_string(&local_118,(uint)bVar3);
    std::operator+(&local_f8,"ADIOS2 BP5 Engine only supports bp format version 5, found ",
                   &local_118);
    std::operator+(&local_d8,&local_f8," version");
    helper::Throw<std::runtime_error>
              ((string *)&writerToFileMap,(string *)&subfileIdx,&local_b8,&local_d8,-1);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&subfileIdx);
    std::__cxx11::string::~string((string *)&writerToFileMap);
    pcVar13 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  (bufferSTL->super_Buffer).m_Position = 0x26;
  bVar3 = pcVar13[0x26];
  (bufferSTL->super_Buffer).m_Position = 0x27;
  if (bVar3 != 2) {
    std::__cxx11::string::string((string *)&writerToFileMap,"Engine",&local_169);
    std::__cxx11::string::string((string *)&subfileIdx,"BP5Writer",&local_16a);
    std::__cxx11::string::string((string *)&local_b8,"CountStepsInMetadataIndex",&local_16b);
    std::__cxx11::to_string(&local_70,2);
    std::operator+(&local_50,"Current ADIOS2 BP5 Engine can only append to bp format 5.",&local_70);
    std::operator+(&local_118,&local_50," but this file is 5.");
    std::__cxx11::to_string(&local_90,(uint)bVar3);
    std::operator+(&local_f8,&local_118,&local_90);
    std::operator+(&local_d8,&local_f8," version");
    helper::Throw<std::runtime_error>
              ((string *)&writerToFileMap,(string *)&subfileIdx,&local_b8,&local_d8,-1);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&subfileIdx);
    std::__cxx11::string::~string((string *)&writerToFileMap);
    pcVar13 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  (bufferSTL->super_Buffer).m_Position = 0x28;
  cVar2 = pcVar13[0x28];
  (bufferSTL->super_Buffer).m_Position = 0x29;
  cVar9 = 'n';
  if (((this->super_Engine).m_IO)->m_ArrayOrder == ColumnMajor) {
    cVar9 = 'y';
  }
  if (cVar9 != cVar2) {
    pcVar19 = "row";
    if (cVar2 == 'y') {
      pcVar19 = "column";
    }
    std::__cxx11::string::string((string *)&writerToFileMap,pcVar19,(allocator *)&subfileIdx);
    std::__cxx11::string::string((string *)&subfileIdx,"Engine",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&local_b8,"BP5Writer",(allocator *)&local_70);
    std::__cxx11::string::string
              ((string *)&local_d8,"CountStepsInMetadataIndex",(allocator *)&local_90);
    std::operator+(&local_118,
                   "ADIOS2 BP5 Engine only supports appending with the same column/row major settings as it was written. Existing file is "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &writerToFileMap);
    std::operator+(&local_f8,&local_118," major");
    helper::Throw<std::runtime_error>((string *)&subfileIdx,&local_b8,&local_d8,&local_f8,-1);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&subfileIdx);
    std::__cxx11::string::~string((string *)&writerToFileMap);
    pcVar13 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  (bufferSTL->super_Buffer).m_Position = 0x40;
  pcVar5 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar17 = (ulong)this->m_AppendWriterCount;
  __new_size = 0;
  sVar21 = 0x40;
  uVar23 = 0;
LAB_004c8d11:
LAB_004c8d14:
  sVar21 = sVar21 + 0x10;
  while (sVar20 = sVar21, sVar20 - 0x10 < (ulong)((long)pcVar5 - (long)pcVar13)) {
    cVar2 = pcVar13[sVar20 - 0x10];
    sVar21 = sVar20 + 9;
    (bufferSTL->super_Buffer).m_Position = sVar20 - 7;
    if (cVar2 == 's') goto LAB_004c8d45;
    if (cVar2 == 'w') {
      uVar17 = *(ulong *)(pcVar13 + (sVar20 - 7));
      (bufferSTL->super_Buffer).m_Position = sVar20 + 1;
      this->m_AppendWriterCount = (uint32_t)uVar17;
      uVar15 = *(uint *)(pcVar13 + sVar20 + 1);
      (bufferSTL->super_Buffer).m_Position = sVar21;
      this->m_AppendAggregatorCount = uVar15;
      uVar22 = *(ulong *)(pcVar13 + sVar21) & 0xffffffff;
      if (__new_size < uVar22) {
        __new_size = uVar22;
      }
      this->m_AppendSubfileCount = (uint)*(ulong *)(pcVar13 + sVar21);
      sVar21 = sVar21 + (uVar17 & 0xffffffff) * 8 + 8;
      (bufferSTL->super_Buffer).m_Position = sVar21;
      goto LAB_004c8d11;
    }
  }
  uVar15 = (this->super_BP5Engine).m_Parameters.AppendAfterSteps;
  if ((int)uVar15 < 0) {
    iVar16 = -1;
    if (-1 < (int)(uVar15 + uVar23)) {
      iVar16 = uVar15 + uVar23;
    }
    uVar15 = iVar16 + 1;
  }
  uVar18 = uVar23;
  if (uVar15 < uVar23) {
    uVar18 = uVar15;
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._0_16_ = auVar11 << 0x40;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_AppendDataPos,__new_size,(value_type_conflict9 *)&writerToFileMap);
  if (uVar18 == 0) {
    this->m_AppendMetadataPos = 0;
    this->m_AppendMetaMetadataPos = 0;
    this->m_AppendMetadataIndexPos = 0;
    goto LAB_004c8fd8;
  }
  this->m_AppendMetadataIndexPos = 0xffffffffffffffff;
  *(undefined4 *)&this->m_AppendMetadataPos = 0xffffffff;
  *(undefined4 *)((long)&this->m_AppendMetadataPos + 4) = 0xffffffff;
  *(undefined4 *)&this->m_AppendMetaMetadataPos = 0xffffffff;
  *(undefined4 *)((long)&this->m_AppendMetaMetadataPos + 4) = 0xffffffff;
  puVar6 = (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar14 = (this->m_AppendDataPos).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar14 != puVar6; puVar14 = puVar14 + 1) {
    *puVar14 = 0xffffffffffffffff;
  }
  if (uVar23 <= uVar15) goto LAB_004c8fd8;
  (bufferSTL->super_Buffer).m_Position = 0x40;
  writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar23 = 0;
  local_98 = &this->m_AppendDataPos;
  while (uVar23 <= uVar18) {
    uVar17 = (bufferSTL->super_Buffer).m_Position;
    pcVar13 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar13) <= uVar17) break;
    cVar2 = pcVar13[uVar17];
    (bufferSTL->super_Buffer).m_Position = uVar17 + 9;
    if (cVar2 == 'w') {
      uVar15 = *(uint *)(pcVar13 + uVar17 + 9);
      (bufferSTL->super_Buffer).m_Position = uVar17 + 0x11;
      this->m_AppendWriterCount = uVar15;
      uVar4 = *(uint *)(pcVar13 + uVar17 + 0x11);
      (bufferSTL->super_Buffer).m_Position = uVar17 + 0x19;
      this->m_AppendAggregatorCount = uVar4;
      uVar4 = *(uint *)(pcVar13 + uVar17 + 0x19);
      (bufferSTL->super_Buffer).m_Position = uVar17 + 0x21;
      this->m_AppendSubfileCount = uVar4;
      if (writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      for (uVar17 = 0; uVar17 < uVar15; uVar17 = uVar17 + 1) {
        sVar21 = (bufferSTL->super_Buffer).m_Position;
        subfileIdx = *(uint64_t *)
                      ((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl
                       .super__Vector_impl_data._M_start + sVar21);
        (bufferSTL->super_Buffer).m_Position = sVar21 + 8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&writerToFileMap,&subfileIdx);
        uVar15 = this->m_AppendWriterCount;
      }
    }
    else if (cVar2 == 's') {
      this->m_AppendMetadataIndexPos = uVar17;
      sVar21 = (bufferSTL->super_Buffer).m_Position;
      sVar20 = *(size_t *)(pcVar13 + sVar21);
      (bufferSTL->super_Buffer).m_Position = sVar21 + 0x10;
      lVar7 = *(long *)(pcVar13 + sVar21 + 0x10);
      (bufferSTL->super_Buffer).m_Position = sVar21 + 0x18;
      this->m_AppendMetadataPos = sVar20;
      uVar17 = lVar7 << 4 | 8;
      uVar15 = this->m_AppendWriterCount;
      if (uVar23 == uVar18) {
        puVar14 = (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        for (uVar22 = 0; uVar15 != uVar22; uVar22 = uVar22 + 1) {
          sVar21 = (bufferSTL->super_Buffer).m_Position;
          uVar8 = *(ulong *)(pcVar13 + sVar21);
          (bufferSTL->super_Buffer).m_Position = sVar21 + uVar17;
          if (uVar8 < puVar14[writerToFileMap.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar22]]) {
            puVar14[writerToFileMap.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar22]] = uVar8;
          }
        }
      }
      else {
        psVar1 = &(bufferSTL->super_Buffer).m_Position;
        *psVar1 = *psVar1 + uVar17 * uVar15;
      }
      uVar23 = uVar23 + 1;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&writerToFileMap.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_004c8fd8:
  return (ulong)uVar18;
LAB_004c8d45:
  (bufferSTL->super_Buffer).m_Position = sVar21;
  sVar21 = sVar21 + (*(long *)(pcVar13 + sVar21) << 4 | 8U) * (uVar17 & 0xffffffff) + 8;
  (bufferSTL->super_Buffer).m_Position = sVar21;
  uVar23 = uVar23 + 1;
  goto LAB_004c8d14;
}

Assistant:

uint64_t BP5Writer::CountStepsInMetadataIndex(format::BufferSTL &bufferSTL)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t &position = bufferSTL.m_Position;

    if (buffer.size() < m_IndexHeaderSize)
    {
        m_AppendMetadataPos = 0;
        m_AppendMetaMetadataPos = 0;
        m_AppendMetadataIndexPos = 0;
        m_AppendDataPos.resize(m_Aggregator->m_NumAggregators,
                               0ULL); // safe bet
        return 0;
    }

    // Check endinanness
    position = m_EndianFlagPosition;
    const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
    bool IsLittleEndian = (endianness == 0) ? true : false;
    if (helper::IsLittleEndian() != IsLittleEndian)
    {
        std::string m = (IsLittleEndian ? "Little" : "Big");

        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports appending with the same "
                                          "endianness. The existing file is " +
                                              m + "Endian");
    }

    // BP version
    position = m_BPVersionPosition;
    uint8_t Version = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    if (Version != 5)
    {
        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports bp format "
                                          "version 5, found " +
                                              std::to_string(Version) + " version");
    }

    // BP minor version
    position = m_BPMinorVersionPosition;
    uint8_t minorVersion = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    if (minorVersion != m_BP5MinorVersion)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "BP5Writer", "CountStepsInMetadataIndex",
            "Current ADIOS2 BP5 Engine can only append to bp format 5." +
                std::to_string(m_BP5MinorVersion) + " but this file is 5." +
                std::to_string(minorVersion) + " version");
    }

    position = m_ColumnMajorFlagPosition;
    const uint8_t columnMajor = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    const uint8_t NowColumnMajor = (m_IO.m_ArrayOrder == ArrayOrdering::ColumnMajor) ? 'y' : 'n';
    if (columnMajor != NowColumnMajor)
    {
        std::string m = (columnMajor == 'y' ? "column" : "row");
        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports appending with the same "
                                          "column/row major settings as it was written."
                                          " Existing file is " +
                                              m + " major");
    }

    position = m_IndexHeaderSize; // after the header
    // Just count the steps first
    unsigned int availableSteps = 0;
    uint64_t nDataFiles = 0;
    while (position < buffer.size())
    {
        const unsigned char recordID =
            helper::ReadValue<unsigned char>(buffer, position, IsLittleEndian);
        position += sizeof(uint64_t); // recordLength

        switch (recordID)
        {
        case IndexRecord::WriterMapRecord: {
            m_AppendWriterCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendAggregatorCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendSubfileCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            if (m_AppendSubfileCount > nDataFiles)
            {
                nDataFiles = m_AppendSubfileCount;
            }
            // jump over writermap
            position += m_AppendWriterCount * sizeof(uint64_t);
            break;
        }
        case IndexRecord::StepRecord: {
            position += 2 * sizeof(uint64_t); // MetadataPos, MetadataSize
            const uint64_t FlushCount =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            // jump over the metadata positions
            position += sizeof(uint64_t) * m_AppendWriterCount * ((2 * FlushCount) + 1);
            availableSteps++;
            break;
        }
        }
    }

    unsigned int targetStep = 0;

    if (m_Parameters.AppendAfterSteps < 0)
    {
        // -1 means append after last step
        int s = (int)availableSteps + m_Parameters.AppendAfterSteps + 1;
        if (s < 0)
        {
            s = 0;
        }
        targetStep = static_cast<unsigned int>(s);
    }
    else
    {
        targetStep = static_cast<unsigned int>(m_Parameters.AppendAfterSteps);
    }
    if (targetStep > availableSteps)
    {
        targetStep = availableSteps;
    }

    m_AppendDataPos.resize(nDataFiles, 0ULL);

    if (!targetStep)
    {
        // append at 0 is like writing new file
        m_AppendMetadataPos = 0;
        m_AppendMetaMetadataPos = 0;
        m_AppendMetadataIndexPos = 0;
        return 0;
    }

    m_AppendMetadataPos = MaxSizeT; // size of header
    m_AppendMetaMetadataPos = MaxSizeT;
    m_AppendMetadataIndexPos = MaxSizeT;
    std::fill(m_AppendDataPos.begin(), m_AppendDataPos.end(), MaxSizeT);

    if (targetStep == availableSteps)
    {
        // append after existing steps
        return targetStep;
    }

    // append but not at 0 and not after existing steps
    // Read each record now completely to get offsets at step+1
    position = m_IndexHeaderSize;
    unsigned int currentStep = 0;
    std::vector<uint64_t> writerToFileMap;
    // reading one step beyond target to get correct offsets
    while (currentStep <= targetStep && position < buffer.size())
    {
        const unsigned char recordID =
            helper::ReadValue<unsigned char>(buffer, position, IsLittleEndian);
        position += sizeof(uint64_t); // recordLength

        switch (recordID)
        {
        case IndexRecord::WriterMapRecord: {
            m_AppendWriterCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendAggregatorCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendSubfileCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);

            // Get the process -> subfile map
            writerToFileMap.clear();
            for (uint64_t i = 0; i < m_AppendWriterCount; i++)
            {
                const uint64_t subfileIdx =
                    helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
                writerToFileMap.push_back(subfileIdx);
            }
            break;
        }
        case IndexRecord::StepRecord: {
            m_AppendMetadataIndexPos =
                position - sizeof(unsigned char) - sizeof(uint64_t); // pos of RecordID
            const uint64_t MetadataPos =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            position += sizeof(uint64_t); // MetadataSize
            const uint64_t FlushCount =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);

            m_AppendMetadataPos = static_cast<size_t>(MetadataPos);

            if (currentStep == targetStep)
            {
                // we need the very first (smallest) write position to each
                // subfile Offsets and sizes,  2*FlushCount + 1 per writer
                for (uint64_t i = 0; i < m_AppendWriterCount; i++)
                {
                    // first flush/write position will do
                    const size_t FirstDataPos = static_cast<size_t>(
                        helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian));
                    position += sizeof(uint64_t) * 2 * FlushCount; // no need to read
                    /* std::cout << "Writer " << i << " subfile " <<
                       writerToFileMap[i]  << "  first data loc:" <<
                       FirstDataPos << std::endl; */
                    if (FirstDataPos < m_AppendDataPos[writerToFileMap[i]])
                    {
                        m_AppendDataPos[writerToFileMap[i]] = FirstDataPos;
                    }
                }
            }
            else
            {
                // jump over all data offsets in this step
                position += sizeof(uint64_t) * m_AppendWriterCount * (1 + 2 * FlushCount);
            }
            currentStep++;
            break;
        }
        }
    }
    return targetStep;
}